

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O3

void Ssc_GiaSimRound(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Wrd_t *pVVar5;
  Vec_Int_t *pVVar6;
  word *__s;
  int *piVar7;
  Gia_Obj_t *pGVar8;
  uint uVar9;
  ulong uVar10;
  ulong *puVar11;
  int iVar12;
  word *pwVar13;
  uint uVar14;
  ulong *puVar15;
  word *pwVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  
  uVar23 = (long)p->vSimsPi->nSize / (long)(p->vCis->nSize - p->nRegs);
  Ssc_GiaResetSimInfo(p);
  uVar1 = p->vSims->nSize;
  uVar2 = p->nObjs;
  iVar12 = (int)uVar23;
  if (iVar12 != (int)uVar1 / (int)uVar2) {
    __assert_fail("nWords == Vec_WrdSize(p->vSims) / Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                  ,0xfd,"void Ssc_GiaSimRound(Gia_Man_t *)");
  }
  if (0 < (int)uVar1) {
    pVVar5 = p->vSimsPi;
    iVar3 = pVVar5->nSize;
    iVar4 = p->nRegs;
    pVVar6 = p->vCis;
    uVar24 = pVVar6->nSize;
    __s = p->vSims->pArray;
    uVar23 = uVar23 & 0xffffffff;
    if (0 < iVar12) {
      memset(__s,0,uVar23 * 8);
    }
    uVar10 = (long)iVar3 / (long)(int)(uVar24 - iVar4);
    uVar9 = (uint)uVar10;
    if (((-1 < (int)uVar9) && (uVar9 < uVar1)) && (0 < iVar3)) {
      uVar10 = uVar10 & 0xffffffff;
      if (0 < (int)uVar24) {
        pwVar13 = pVVar5->pArray;
        pwVar16 = __s + uVar10;
        piVar7 = pVVar6->pArray;
        uVar18 = 0;
        do {
          iVar3 = piVar7[uVar18];
          if ((iVar3 < 0) || ((int)uVar2 <= iVar3)) goto LAB_0063ee00;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (uVar1 <= iVar3 * uVar9) goto LAB_0063ede1;
          if (pwVar16 != __s + iVar3 * uVar9) {
            __assert_fail("pSim == Gia_ObjSimObj( p, pObj )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                          ,0x105,"void Ssc_GiaSimRound(Gia_Man_t *)");
          }
          if (0 < iVar12) {
            uVar21 = 0;
            do {
              pwVar16[uVar21] = pwVar13[uVar21];
              uVar21 = uVar21 + 1;
            } while (uVar23 != uVar21);
          }
          pwVar16 = pwVar16 + iVar12;
          uVar18 = uVar18 + 1;
          pwVar13 = pwVar13 + iVar12;
        } while (uVar18 != uVar24);
      }
      uVar24 = (uVar24 + 1) * uVar9;
      if (uVar24 < uVar1) {
        if ((0 < (int)uVar2) && (pGVar8 = p->pObjs, pGVar8 != (Gia_Obj_t *)0x0)) {
          puVar15 = __s + uVar24;
          uVar18 = 0;
          do {
            uVar21 = *(ulong *)(pGVar8 + uVar18);
            uVar24 = (uint)uVar21;
            if ((~uVar24 & 0x1fffffff) != 0 && -1 < (int)uVar24) {
              uVar19 = uVar18 * uVar10;
              if (uVar1 <= uVar19) goto LAB_0063ede1;
              if (puVar15 != __s + uVar19) {
                __assert_fail("pSim == Gia_ObjSim( p, i )",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                              ,0x10e,"void Ssc_GiaSimRound(Gia_Man_t *)");
              }
              lVar20 = (long)(int)((uVar24 & 0x1fffffff) * iVar12);
              lVar22 = (long)(int)(((uint)(uVar21 >> 0x20) & 0x1fffffff) * iVar12);
              if ((uVar21 >> 0x3d & 1) == 0 || (uVar24 >> 0x1d & 1) == 0) {
                if ((uVar24 >> 0x1d & 1) == 0) {
                  if ((uVar21 >> 0x3d & 1) == 0) {
                    puVar11 = puVar15;
                    uVar21 = uVar23;
                    if (0 < iVar12) {
                      do {
                        *puVar11 = puVar11[-lVar22] & puVar11[-lVar20];
                        uVar21 = uVar21 - 1;
                        puVar11 = puVar11 + 1;
                      } while (uVar21 != 0);
                    }
                  }
                  else {
                    puVar11 = puVar15;
                    uVar21 = uVar23;
                    if (0 < iVar12) {
                      do {
                        *puVar11 = ~puVar11[-lVar22] & puVar11[-lVar20];
                        uVar21 = uVar21 - 1;
                        puVar11 = puVar11 + 1;
                      } while (uVar21 != 0);
                    }
                  }
                }
                else {
                  puVar11 = puVar15;
                  uVar21 = uVar23;
                  if (0 < iVar12) {
                    do {
                      *puVar11 = ~puVar11[-lVar20] & puVar11[-lVar22];
                      uVar21 = uVar21 - 1;
                      puVar11 = puVar11 + 1;
                    } while (uVar21 != 0);
                  }
                }
              }
              else {
                puVar11 = puVar15;
                uVar21 = uVar23;
                if (0 < iVar12) {
                  do {
                    *puVar11 = ~(puVar11[-lVar22] | puVar11[-lVar20]);
                    uVar21 = uVar21 - 1;
                    puVar11 = puVar11 + 1;
                  } while (uVar21 != 0);
                }
              }
              puVar15 = puVar15 + iVar12;
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar2);
        }
        pVVar6 = p->vCos;
        uVar24 = pVVar6->nSize;
        uVar17 = uVar24 - iVar4;
        uVar14 = (uVar2 - uVar17) * uVar9;
        if (uVar14 < uVar1) {
          if (0 < (int)uVar17) {
            pwVar16 = __s + uVar14;
            uVar18 = 0;
            uVar10 = (ulong)uVar24;
            if ((int)uVar24 < 1) {
              uVar10 = uVar18;
            }
            do {
              if (uVar18 == uVar10) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar3 = pVVar6->pArray[uVar18];
              if (((long)iVar3 < 0) || ((int)uVar2 <= iVar3)) {
LAB_0063ee00:
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              if (p->pObjs == (Gia_Obj_t *)0x0) {
                return;
              }
              if (uVar1 <= iVar3 * uVar9) goto LAB_0063ede1;
              if (pwVar16 != __s + iVar3 * uVar9) {
                __assert_fail("pSim == Gia_ObjSimObj( p, pObj )",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                              ,0x118,"void Ssc_GiaSimRound(Gia_Man_t *)");
              }
              uVar24 = *(uint *)(p->pObjs + iVar3);
              lVar20 = (long)(int)((uVar24 & 0x1fffffff) * iVar12);
              if ((uVar24 >> 0x1d & 1) == 0) {
                if (0 < iVar12) {
                  uVar21 = 0;
                  do {
                    pwVar16[uVar21] = pwVar16[uVar21 - lVar20];
                    uVar21 = uVar21 + 1;
                  } while (uVar23 != uVar21);
                }
              }
              else if (0 < iVar12) {
                uVar21 = 0;
                do {
                  pwVar16[uVar21] = ~pwVar16[uVar21 - lVar20];
                  uVar21 = uVar21 + 1;
                } while (uVar23 != uVar21);
              }
              pwVar16 = pwVar16 + iVar12;
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar17);
          }
          return;
        }
      }
    }
  }
LAB_0063ede1:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

void Ssc_GiaSimRound( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    word * pSim, * pSim0, * pSim1;
    int i, nWords = Gia_ObjSimWords(p);
    Ssc_GiaResetSimInfo( p );
    assert( nWords == Vec_WrdSize(p->vSims) / Gia_ManObjNum(p) );
    // constant node
    Ssc_SimConst( Gia_ObjSim(p, 0), nWords, 0 );
    // primary inputs
    pSim = Gia_ObjSim( p, 1 );
    pSim0 = Gia_ObjSimPi( p, 0 );
    Gia_ManForEachCi( p, pObj, i )
    {
        assert( pSim == Gia_ObjSimObj( p, pObj ) );
        Ssc_SimDup( pSim, pSim0, nWords, 0 );
        pSim += nWords;
        pSim0 += nWords;
    }
    // intermediate nodes
    pSim = Gia_ObjSim( p, 1+Gia_ManCiNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        assert( pSim == Gia_ObjSim( p, i ) );
        pSim0 = pSim - pObj->iDiff0 * nWords;
        pSim1 = pSim - pObj->iDiff1 * nWords;
        Ssc_SimAnd( pSim, pSim0, pSim1, nWords, Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj) );
        pSim += nWords;
    }
    // primary outputs
    pSim = Gia_ObjSim( p, Gia_ManObjNum(p) - Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
        assert( pSim == Gia_ObjSimObj( p, pObj ) );
        pSim0 = pSim - pObj->iDiff0 * nWords;
        Ssc_SimDup( pSim, pSim0, nWords, Gia_ObjFaninC0(pObj) );
//        Extra_PrintBinary( stdout, pSim, 64 ), printf( "\n" );
        pSim += nWords;
    }
}